

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjpeg.c
# Opt level: O1

void usage(void)

{
  fprintf(_stderr,"usage: %s [switches] ",progname);
  fwrite("[inputfile]\n",0xc,1,_stderr);
  fwrite("Switches (names may be abbreviated):\n",0x25,1,_stderr);
  fwrite("  -quality N[,...]   Compression quality (0..100; 5-95 is most useful range,\n",0x4d,1,
         _stderr);
  fwrite("                     default is 75)\n",0x24,1,_stderr);
  fwrite("  -grayscale     Create monochrome JPEG file\n",0x2d,1,_stderr);
  fwrite("  -rgb           Create RGB JPEG file\n",0x26,1,_stderr);
  fwrite("  -optimize      Optimize Huffman table (smaller file, but slow compression)\n",0x4d,1,
         _stderr);
  fwrite("  -progressive   Create progressive JPEG file\n",0x2e,1,_stderr);
  fwrite("  -targa         Input file is Targa format (usually not needed)\n",0x41,1,_stderr);
  fwrite("Switches for advanced users:\n",0x1d,1,_stderr);
  fwrite("  -arithmetic    Use arithmetic coding\n",0x27,1,_stderr);
  fprintf(_stderr,"  -dct int       Use accurate integer DCT method%s\n"," (default)");
  fprintf(_stderr,"  -dct fast      Use less accurate integer DCT method [legacy feature]%s\n","");
  fprintf(_stderr,"  -dct float     Use floating-point DCT method [legacy feature]%s\n","");
  fwrite("  -icc FILE      Embed ICC profile contained in FILE\n",0x35,1,_stderr);
  fwrite("  -restart N     Set restart interval in rows, or in blocks with B\n",0x43,1,_stderr);
  fwrite("  -smooth N      Smooth dithered input (N=1..100 is strength)\n",0x3e,1,_stderr);
  fwrite("  -maxmemory N   Maximum memory to use (in kbytes)\n",0x33,1,_stderr);
  fwrite("  -outfile name  Specify name for output file\n",0x2e,1,_stderr);
  fwrite("  -memdst        Compress to memory instead of file (useful for benchmarking)\n",0x4e,1,
         _stderr);
  fwrite("  -report        Report compression progress\n",0x2d,1,_stderr);
  fwrite("  -verbose  or  -debug   Emit debug output\n",0x2b,1,_stderr);
  fwrite("  -version       Print version information and exit\n",0x34,1,_stderr);
  fwrite("Switches for wizards:\n",0x16,1,_stderr);
  fwrite("  -baseline      Force baseline quantization tables\n",0x34,1,_stderr);
  fwrite("  -qtables FILE  Use quantization tables given in FILE\n",0x37,1,_stderr);
  fwrite("  -qslots N[,...]    Set component quantization tables\n",0x37,1,_stderr);
  fwrite("  -sample HxV[,...]  Set component sampling factors\n",0x34,1,_stderr);
  fwrite("  -scans FILE    Create multi-scan JPEG per script FILE\n",0x38,1,_stderr);
  exit(1);
}

Assistant:

LOCAL(void)
usage(void)
/* complain about bad command line */
{
  fprintf(stderr, "usage: %s [switches] ", progname);
#ifdef TWO_FILE_COMMANDLINE
  fprintf(stderr, "inputfile outputfile\n");
#else
  fprintf(stderr, "[inputfile]\n");
#endif

  fprintf(stderr, "Switches (names may be abbreviated):\n");
  fprintf(stderr, "  -quality N[,...]   Compression quality (0..100; 5-95 is most useful range,\n");
  fprintf(stderr, "                     default is 75)\n");
  fprintf(stderr, "  -grayscale     Create monochrome JPEG file\n");
  fprintf(stderr, "  -rgb           Create RGB JPEG file\n");
#ifdef ENTROPY_OPT_SUPPORTED
  fprintf(stderr, "  -optimize      Optimize Huffman table (smaller file, but slow compression)\n");
#endif
#ifdef C_PROGRESSIVE_SUPPORTED
  fprintf(stderr, "  -progressive   Create progressive JPEG file\n");
#endif
#ifdef TARGA_SUPPORTED
  fprintf(stderr, "  -targa         Input file is Targa format (usually not needed)\n");
#endif
  fprintf(stderr, "Switches for advanced users:\n");
#ifdef C_ARITH_CODING_SUPPORTED
  fprintf(stderr, "  -arithmetic    Use arithmetic coding\n");
#endif
#ifdef DCT_ISLOW_SUPPORTED
  fprintf(stderr, "  -dct int       Use accurate integer DCT method%s\n",
          (JDCT_DEFAULT == JDCT_ISLOW ? " (default)" : ""));
#endif
#ifdef DCT_IFAST_SUPPORTED
  fprintf(stderr, "  -dct fast      Use less accurate integer DCT method [legacy feature]%s\n",
          (JDCT_DEFAULT == JDCT_IFAST ? " (default)" : ""));
#endif
#ifdef DCT_FLOAT_SUPPORTED
  fprintf(stderr, "  -dct float     Use floating-point DCT method [legacy feature]%s\n",
          (JDCT_DEFAULT == JDCT_FLOAT ? " (default)" : ""));
#endif
  fprintf(stderr, "  -icc FILE      Embed ICC profile contained in FILE\n");
  fprintf(stderr, "  -restart N     Set restart interval in rows, or in blocks with B\n");
#ifdef INPUT_SMOOTHING_SUPPORTED
  fprintf(stderr, "  -smooth N      Smooth dithered input (N=1..100 is strength)\n");
#endif
  fprintf(stderr, "  -maxmemory N   Maximum memory to use (in kbytes)\n");
  fprintf(stderr, "  -outfile name  Specify name for output file\n");
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
  fprintf(stderr, "  -memdst        Compress to memory instead of file (useful for benchmarking)\n");
#endif
  fprintf(stderr, "  -report        Report compression progress\n");
  fprintf(stderr, "  -verbose  or  -debug   Emit debug output\n");
  fprintf(stderr, "  -version       Print version information and exit\n");
  fprintf(stderr, "Switches for wizards:\n");
  fprintf(stderr, "  -baseline      Force baseline quantization tables\n");
  fprintf(stderr, "  -qtables FILE  Use quantization tables given in FILE\n");
  fprintf(stderr, "  -qslots N[,...]    Set component quantization tables\n");
  fprintf(stderr, "  -sample HxV[,...]  Set component sampling factors\n");
#ifdef C_MULTISCAN_FILES_SUPPORTED
  fprintf(stderr, "  -scans FILE    Create multi-scan JPEG per script FILE\n");
#endif
  exit(EXIT_FAILURE);
}